

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O3

void cfd::core::logger::log<double&,long&,long&,long&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,double *args,long *args_1,
               long *args_2,long *args_3)

{
  bool bVar1;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar3;
  string_view format_str;
  format_args args_00;
  string local_98;
  double local_78 [2];
  long local_68;
  long local_58;
  long local_48;
  
  aVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
           )args_2;
  bVar1 = IsEnableLogLevel(lvl);
  if (bVar1) {
    local_78[0] = *args;
    local_68 = *args_1;
    local_58 = *args_2;
    local_48 = *args_3;
    pcVar2 = (char *)strlen(fmt);
    format_str.size_ = 0x333a;
    format_str.data_ = pcVar2;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar3.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_78;
    ::fmt::v7::detail::vformat_abi_cxx11_(&local_98,(detail *)fmt,format_str,args_00);
    WriteLog(source,lvl,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}